

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcDrawBuffersIndexedBase.cpp
# Opt level: O0

int __thiscall glcts::DrawBuffersIndexedBase::init(DrawBuffersIndexedBase *this,EVP_PKEY_CTX *ctx)

{
  bool bVar1;
  undefined8 uVar2;
  NotSupportedError *this_00;
  allocator<char> local_69;
  string local_68;
  allocator<char> local_31;
  string local_30;
  DrawBuffersIndexedBase *local_10;
  DrawBuffersIndexedBase *this_local;
  
  local_10 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_30,"GL_OES_draw_buffers_indexed",&local_31);
  bVar1 = TestCaseBase::isExtensionSupported(&this->super_TestCaseBase,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  uVar2 = std::allocator<char>::~allocator(&local_31);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    return (uint)CONCAT71((int7)((ulong)uVar2 >> 8),bVar1) ^ 0xff;
  }
  this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_68,"Draw buffers indexed functionality not supported, skipping",
             &local_69);
  tcu::NotSupportedError::NotSupportedError(this_00,&local_68);
  __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::NotSupportedError::~NotSupportedError);
}

Assistant:

void DrawBuffersIndexedBase::init()
{
	if (!isExtensionSupported("GL_OES_draw_buffers_indexed"))
	{
		throw tcu::NotSupportedError(DRAW_BUFFERS_INDEXED_NOT_SUPPORTED);
	}
}